

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Vec<float,_4UL> *v)

{
  ostream *poVar1;
  int i;
  long lVar2;
  char local_29;
  
  local_29 = '[';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_29,1);
  lVar2 = 0;
  do {
    poVar1 = std::ostream::_M_insert<double>((double)v->data[lVar2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  poVar1 = (ostream *)std::ostream::operator<<(os,v->data[3]);
  std::operator<<(poVar1,']');
  if ((ulong)poVar1 >> 0x3d != 0) {
    std::__throw_bad_array_new_length();
  }
  std::__throw_bad_alloc();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vec<T, N>& v) {
        os << '[';

        for (int i = 0; i < N - 1; i++) {
            os << v.data[i] << ", ";
        }

        os << v.data[N - 1] << ']';
    }